

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  uint32_t uVar1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t X;
  DecodeStatus DVar3;
  uint local_58;
  uint local_54;
  uint simm13;
  uint rs2;
  _Bool isImm;
  uint rs1;
  uint rd;
  DecodeStatus status;
  DecodeFunc DecodeRD_local;
  _Bool isLoad_local;
  void *Decoder_local;
  uint64_t Address_local;
  uint insn_local;
  MCInst *MI_local;
  
  uVar1 = fieldFromInstruction_4(insn,0x19,5);
  RegNo = fieldFromInstruction_4(insn,0xe,5);
  uVar2 = fieldFromInstruction_4(insn,0xd,1);
  local_54 = 0;
  local_58 = 0;
  if (uVar2 == 0) {
    local_54 = fieldFromInstruction_4(insn,0,5);
  }
  else {
    X = fieldFromInstruction_4(insn,0,0xd);
    local_58 = SignExtend32(X,0xd);
  }
  if (((!isLoad) ||
      (MI_local._4_4_ = (*DecodeRD)(MI,uVar1,Address,Decoder),
      MI_local._4_4_ == MCDisassembler_Success)) &&
     (MI_local._4_4_ = DecodeIntRegsRegisterClass(MI,RegNo,Address,Decoder),
     MI_local._4_4_ == MCDisassembler_Success)) {
    if (uVar2 == 0) {
      DVar3 = DecodeIntRegsRegisterClass(MI,local_54,Address,Decoder);
      if (DVar3 != MCDisassembler_Success) {
        return DVar3;
      }
    }
    else {
      MCOperand_CreateImm0(MI,(ulong)local_58);
    }
    if ((isLoad) ||
       (MI_local._4_4_ = (*DecodeRD)(MI,uVar1,Address,Decoder),
       MI_local._4_4_ == MCDisassembler_Success)) {
      MI_local._4_4_ = MCDisassembler_Success;
    }
  }
  return MI_local._4_4_;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder,
		bool isLoad, DecodeFunc DecodeRD)
{
	DecodeStatus status;
	unsigned rd = fieldFromInstruction_4(insn, 25, 5);
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	bool isImm = fieldFromInstruction_4(insn, 13, 1);
	unsigned rs2 = 0;
	unsigned simm13 = 0;

	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	if (isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	// Decode rs1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode imm|rs2.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	if (!isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}